

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracy_concurrentqueue.h
# Opt level: O1

Block * __thiscall
tracy::moodycamel::
ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
requisition_block(ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
                  *this)

{
  atomic<unsigned_long> *paVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict1 _Var3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Block *pBVar7;
  Block *pBVar8;
  __pointer_type pBVar9;
  __pointer_type pBVar10;
  Block *pBVar11;
  bool bVar12;
  bool bVar13;
  
  uVar6 = this->initialBlockPoolSize;
  if ((this->initialBlockPoolIndex).super___atomic_base<unsigned_long>._M_i < uVar6) {
    LOCK();
    paVar1 = &this->initialBlockPoolIndex;
    uVar4 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    pBVar11 = (Block *)0x0;
    if (uVar4 < uVar6) {
      pBVar11 = this->initialBlockPool + uVar4;
    }
  }
  else {
    pBVar11 = (Block *)0x0;
  }
  if (pBVar11 == (Block *)0x0) {
    pBVar7 = (this->freeList).freeListHead._M_b._M_p;
    do {
      if (pBVar7 == (Block *)0x0) {
        pBVar11 = (Block *)0x0;
        break;
      }
      uVar5 = (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i;
      if ((uVar5 & 0x7fffffff) == 0) {
LAB_002fd8a8:
        pBVar8 = (this->freeList).freeListHead._M_b._M_p;
        bVar12 = false;
      }
      else {
        LOCK();
        bVar12 = uVar5 == (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i;
        if (bVar12) {
          (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i = uVar5 + 1;
        }
        UNLOCK();
        if (!bVar12) goto LAB_002fd8a8;
        LOCK();
        pBVar8 = (this->freeList).freeListHead._M_b._M_p;
        bVar12 = pBVar7 == pBVar8;
        if (bVar12) {
          (this->freeList).freeListHead._M_b._M_p = (pBVar7->freeListNext)._M_b._M_p;
          pBVar8 = pBVar7;
        }
        UNLOCK();
        if (bVar12) {
          if ((int)(pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i < 0) {
            __assert_fail("(head->freeListRefs.load(std::memory_order_relaxed) & SHOULD_BE_ON_FREELIST) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/client/tracy_concurrentqueue.h"
                          ,699,
                          "N *tracy::moodycamel::ConcurrentQueue<tracy::QueueItem>::FreeList<tracy::moodycamel::ConcurrentQueue<tracy::QueueItem>::Block>::try_get() [T = tracy::QueueItem, Traits = tracy::moodycamel::ConcurrentQueueDefaultTraits, N = tracy::moodycamel::ConcurrentQueue<tracy::QueueItem>::Block]"
                         );
          }
          LOCK();
          (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i =
               (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i - 2;
          UNLOCK();
          bVar12 = true;
          pBVar11 = pBVar7;
          pBVar8 = pBVar7;
        }
        else {
          LOCK();
          paVar2 = &pBVar7->freeListRefs;
          _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          bVar12 = false;
          if (_Var3 == 0x80000001) {
            pBVar9 = (this->freeList).freeListHead._M_b._M_p;
            do {
              (pBVar7->freeListNext)._M_b._M_p = pBVar9;
              (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
              LOCK();
              pBVar10 = (this->freeList).freeListHead._M_b._M_p;
              bVar13 = pBVar9 == pBVar10;
              if (bVar13) {
                (this->freeList).freeListHead._M_b._M_p = pBVar7;
                pBVar10 = pBVar9;
              }
              UNLOCK();
              if (bVar13) break;
              LOCK();
              paVar2 = &pBVar7->freeListRefs;
              _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
              (paVar2->super___atomic_base<unsigned_int>)._M_i =
                   (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
              UNLOCK();
              pBVar9 = pBVar10;
            } while (_Var3 == 1);
          }
        }
      }
      pBVar7 = pBVar8;
    } while (!bVar12);
    if (pBVar11 == (Block *)0x0) {
      InitRpmalloc();
      pBVar11 = (Block *)rpmalloc(0x200030);
      (pBVar11->freeListRefs).super___atomic_base<unsigned_int>._M_i = 0;
      (pBVar11->freeListNext)._M_b._M_p = (__pointer_type)0x0;
      pBVar11->shouldBeOnFreeList = (__atomic_base<bool>)0x0;
      pBVar11->dynamicallyAllocated = true;
      pBVar11->next = (Block *)0x0;
      (pBVar11->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
    }
  }
  return pBVar11;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}

		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}

		return create<Block>();
	}